

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math_base.h
# Opt level: O0

bool __thiscall
LineBase2D<float>::intersection
          (LineBase2D<float> *this,LineBase2D<float> *line,PointBase2D<float> *point)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined8 *in_RDX;
  long in_RSI;
  float *in_RDI;
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  float na;
  PointBase2D<float> offset;
  float denominator;
  PointBase2D<float> *in_stack_ffffffffffffffa8;
  PointBase2D<float> *this_00;
  PointBase2D<float> local_44 [2];
  float local_34;
  undefined8 local_30;
  undefined4 local_28;
  float local_24;
  undefined8 *local_20;
  long local_18;
  bool local_1;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  auVar2 = vfmadd213ss_fma(ZEXT416(*(uint *)(in_RSI + 8)),ZEXT416((uint)in_RDI[3]),
                           ZEXT416((uint)-(in_RDI[2] * *(float *)(in_RSI + 0xc))));
  local_24 = auVar2._0_4_;
  local_28 = 0;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_1 = pvmath::isEqual<float>(in_RDI,&in_stack_ffffffffffffffa8->x,0.0);
  if (!local_1) {
    auVar3._0_8_ = PointBase2D<float>::operator-
                             (in_stack_ffffffffffffffa8,(PointBase2D<float> *)0x24d3b3);
    auVar3._8_56_ = extraout_var;
    uVar1 = vmovlpd_avx(auVar3._0_16_);
    local_30._0_4_ = (uint)uVar1;
    local_30._4_4_ = (float)((ulong)uVar1 >> 0x20);
    auVar2 = vfmsub213ss_fma(ZEXT416((uint)local_30),ZEXT416(*(uint *)(local_18 + 0xc)),
                             ZEXT416((uint)(*(float *)(local_18 + 8) * local_30._4_4_)));
    local_34 = auVar2._0_4_ / local_24;
    this_00 = local_44;
    local_30 = uVar1;
    PointBase2D<float>::PointBase2D(this_00,in_RDI[2] * local_34,in_RDI[3] * local_34);
    auVar4._0_8_ = PointBase2D<float>::operator+(this_00,(PointBase2D<float> *)0x24d426);
    auVar4._8_56_ = extraout_var_00;
    uVar1 = vmovlpd_avx(auVar4._0_16_);
    *local_20 = uVar1;
  }
  local_1 = !local_1;
  return local_1;
}

Assistant:

bool intersection( const LineBase2D & line, PointBase2D<_Type> & point ) const
    {
        // based on Graphics Gems III, Faster Line Segment Intersection, p. 199-202
        // http://www.realtimerendering.com/resources/GraphicsGems/gems.html#gemsiii
        const _Type denominator = _direction.y * line._direction.x - _direction.x * line._direction.y;
        if ( pvmath::isEqual<_Type>( denominator, 0, 10 ) )
            return false; // they are parallel

        const PointBase2D<_Type> offset = _position - line._position;
        const _Type na = (line._direction.y * offset.x - line._direction.x * offset.y) / denominator;
        point = _position + PointBase2D<_Type>( _direction.x * na, _direction.y * na );
        return true;
    }